

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O1

void * ngx_slab_alloc_locked(ngx_slab_pool_t *pool,size_t size)

{
  ngx_uint_t *pnVar1;
  ulong *puVar2;
  ulong *puVar3;
  u_char *puVar4;
  ulong uVar5;
  ngx_slab_stat_t *pnVar6;
  bool bVar7;
  byte bVar8;
  ngx_slab_page_t *pnVar9;
  long lVar10;
  long lVar11;
  ngx_slab_stat_t *pnVar12;
  ulong uVar13;
  ulong uVar14;
  ngx_slab_page_t *pnVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  u_char *puVar19;
  long lVar20;
  long lVar21;
  
  if (ngx_slab_max_size < size) {
    if ((ngx_cycle->log->log_level & 0x20) != 0) {
      ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %uz",size);
    }
    puVar19 = (u_char *)0x0;
    pnVar9 = ngx_slab_alloc_pages
                       (pool,((size >> ((byte)ngx_pagesize_shift & 0x3f)) + 1) -
                             (ulong)(size % ngx_pagesize == 0));
    if (pnVar9 != (ngx_slab_page_t *)0x0) {
      puVar19 = pool->start +
                (((long)pnVar9 - (long)pool->pages >> 3) * -0x5555555555555555 <<
                ((byte)ngx_pagesize_shift & 0x3f));
    }
  }
  else {
    if (pool->min_size < size) {
      sVar18 = 1;
      if (2 < size) {
        uVar13 = size - 1;
        do {
          sVar18 = sVar18 + 1;
          bVar7 = 3 < uVar13;
          uVar13 = uVar13 >> 1;
        } while (bVar7);
      }
      lVar20 = sVar18 - pool->min_shift;
    }
    else {
      sVar18 = pool->min_shift;
      lVar20 = 0;
    }
    pnVar1 = &pool->stats[lVar20].reqs;
    *pnVar1 = *pnVar1 + 1;
    if ((ngx_cycle->log->log_level & 0x20) != 0) {
      ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %uz slot: %ui",size);
    }
    puVar2 = (ulong *)(&pool[1].min_size)[lVar20 * 3];
    puVar3 = (ulong *)puVar2[1];
    bVar8 = (byte)sVar18;
    if (puVar3 != puVar2) {
      if (sVar18 < ngx_slab_exact_shift) {
        lVar10 = ((long)puVar2 - (long)pool->pages >> 3) * -0x5555555555555555 <<
                 ((byte)ngx_pagesize_shift & 0x3f);
        uVar13 = ngx_pagesize >> (bVar8 & 0x3f);
        if (0x3f < uVar13) {
          puVar4 = pool->start;
          uVar13 = uVar13 >> 6;
          uVar14 = 1;
          lVar11 = 0;
          uVar16 = 0;
          do {
            uVar5 = *(ulong *)(puVar4 + uVar16 * 8 + lVar10);
            if (uVar5 != 0xffffffffffffffff) {
              uVar17 = 1;
              lVar21 = 0;
              do {
                if ((uVar17 & uVar5) == 0) {
                  *(ulong *)(puVar4 + uVar16 * 8 + lVar10) = uVar17 | uVar5;
                  pnVar1 = &pool->stats[lVar20].used;
                  *pnVar1 = *pnVar1 + 1;
                  puVar19 = puVar4 + (lVar21 - lVar11 << (bVar8 & 0x3f)) + lVar10;
                  lVar20 = *(long *)(puVar4 + uVar16 * 8 + lVar10);
                  goto joined_r0x0011e6f8;
                }
                uVar17 = uVar17 * 2;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 0x40);
            }
            uVar16 = uVar16 + 1;
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + -0x40;
          } while (uVar16 != uVar13);
        }
      }
      else if (sVar18 == ngx_slab_exact_shift) {
        uVar13 = 1;
        lVar10 = 0;
        do {
          if ((*puVar2 & uVar13) == 0) {
            uVar13 = *puVar2 | uVar13;
            *puVar2 = uVar13;
            if (uVar13 == 0xffffffffffffffff) {
              uVar13 = puVar2[2];
              *(ulong **)((uVar13 & 0xfffffffffffffffc) + 8) = puVar3;
              *(ulong *)(puVar2[1] + 0x10) = uVar13;
              puVar2[1] = 0;
              puVar2[2] = 2;
            }
LAB_0011e821:
            puVar19 = pool->start +
                      (((long)puVar2 - (long)pool->pages >> 3) * -0x5555555555555555 <<
                      ((byte)ngx_pagesize_shift & 0x3f)) + (lVar10 << (bVar8 & 0x3f));
            pnVar1 = &pool->stats[lVar20].used;
            *pnVar1 = *pnVar1 + 1;
            goto LAB_0011e85d;
          }
          uVar13 = uVar13 * 2;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x40);
      }
      else {
        uVar13 = -1L << ((byte)(ngx_pagesize >> (bVar8 & 0x3f)) & 0x3f);
        if ((uVar13 & 1) == 0) {
          uVar16 = (ulong)~(uint)uVar13 << 0x20;
          uVar14 = 0x100000000;
          uVar13 = *puVar2;
          lVar10 = 0;
          do {
            if ((uVar13 & uVar14) == 0) {
              *puVar2 = uVar13 | uVar14;
              if ((uVar13 & 0xffffffff00000000 | uVar14) == uVar16) {
                uVar13 = puVar2[2];
                *(ulong **)((uVar13 & 0xfffffffffffffffc) + 8) = puVar3;
                *(ulong *)(puVar2[1] + 0x10) = uVar13;
                puVar2[1] = 0;
                puVar2[2] = 1;
              }
              goto LAB_0011e821;
            }
            uVar14 = uVar14 * 2;
            lVar10 = lVar10 + 1;
          } while ((uVar14 & uVar16) != 0);
        }
      }
      ngx_slab_error(pool,2,"ngx_slab_alloc(): page is busy");
      ngx_debug_point();
    }
    pnVar9 = ngx_slab_alloc_pages(pool,1);
    if (pnVar9 == (ngx_slab_page_t *)0x0) {
      pnVar1 = &pool->stats[lVar20].fails;
      *pnVar1 = *pnVar1 + 1;
      puVar19 = (u_char *)0x0;
    }
    else {
      pnVar15 = (ngx_slab_page_t *)(&pool[1].lock + lVar20 * 3);
      if (sVar18 < ngx_slab_exact_shift) {
        lVar11 = ((long)pnVar9 - (long)pool->pages >> 3) * -0x5555555555555555;
        lVar10 = lVar11 << ((byte)ngx_pagesize_shift & 0x3f);
        uVar16 = ngx_pagesize >> (bVar8 & 0x3f);
        puVar19 = pool->start;
        uVar14 = (ulong)(8 << (bVar8 & 0x1f));
        uVar13 = 1;
        if (uVar14 <= uVar16) {
          uVar13 = uVar16 / uVar14;
        }
        *(long *)(puVar19 + lVar10) = (2L << ((byte)uVar13 & 0x3f)) + -1;
        uVar14 = ngx_pagesize >> (bVar8 & 0x3f);
        if (0x7f < uVar14) {
          memset(puVar19 + lVar10 + 8,0,(uVar14 >> 6) * 8 - 8);
        }
        pnVar9->slab = sVar18;
        pnVar9->next = pnVar15;
        pnVar9->prev = (ulong)pnVar15 | 3;
        (&pool[1].min_size)[lVar20 * 3] = (size_t)pnVar9;
        pnVar12 = pool->stats;
        pnVar12[lVar20].total = pnVar12[lVar20].total + ((ngx_pagesize >> (bVar8 & 0x3f)) - uVar13);
        puVar19 = puVar19 + (uVar13 << (bVar8 & 0x3f)) +
                            (lVar11 << ((byte)ngx_pagesize_shift & 0x3f));
      }
      else {
        if (sVar18 == ngx_slab_exact_shift) {
          pnVar9->slab = 1;
          pnVar9->next = pnVar15;
          pnVar9->prev = (ulong)pnVar15 | 2;
          (&pool[1].min_size)[lVar20 * 3] = (size_t)pnVar9;
          pnVar6 = pool->stats;
          pnVar12 = pnVar6 + lVar20;
          pnVar12->total = pnVar12->total + 0x40;
          puVar19 = pool->start +
                    (((long)pnVar9 - (long)pool->pages >> 3) * -0x5555555555555555 <<
                    ((byte)ngx_pagesize_shift & 0x3f));
          pnVar1 = &pnVar6[lVar20].used;
          *pnVar1 = *pnVar1 + 1;
          goto LAB_0011e85d;
        }
        pnVar9->slab = sVar18 | 0x100000000;
        pnVar9->next = pnVar15;
        pnVar9->prev = (ulong)pnVar15 | 1;
        (&pool[1].min_size)[lVar20 * 3] = (size_t)pnVar9;
        pnVar12 = pool->stats;
        pnVar12[lVar20].total = pnVar12[lVar20].total + (ngx_pagesize >> (bVar8 & 0x3f));
        puVar19 = pool->start +
                  (((long)pnVar9 - (long)pool->pages >> 3) * -0x5555555555555555 <<
                  ((byte)ngx_pagesize_shift & 0x3f));
      }
      pnVar12[lVar20].used = pnVar12[lVar20].used + 1;
    }
  }
LAB_0011e85d:
  if ((ngx_cycle->log->log_level & 0x20) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %p",puVar19);
  }
  return puVar19;
joined_r0x0011e6f8:
  if (lVar20 != -1) goto LAB_0011e85d;
  if (uVar13 <= uVar14) {
    uVar13 = puVar2[2];
    *(ulong **)((uVar13 & 0xfffffffffffffffc) + 8) = puVar3;
    *(ulong *)(puVar2[1] + 0x10) = uVar13;
    puVar2[1] = 0;
    puVar2[2] = 3;
    goto LAB_0011e85d;
  }
  lVar20 = *(long *)(puVar4 + uVar14 * 8 + lVar10);
  uVar14 = uVar14 + 1;
  goto joined_r0x0011e6f8;
}

Assistant:

void *
ngx_slab_alloc_locked(ngx_slab_pool_t *pool, size_t size)
{
    size_t            s;
    uintptr_t         p, n, m, mask, *bitmap;
    ngx_uint_t        i, slot, shift, map;
    ngx_slab_page_t  *page, *prev, *slots;

    if (size > ngx_slab_max_size) {

        ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                       "slab alloc: %uz", size);

        page = ngx_slab_alloc_pages(pool, (size >> ngx_pagesize_shift)
                                          + ((size % ngx_pagesize) ? 1 : 0));
        if (page) {
            p = ngx_slab_page_addr(pool, page);

        } else {
            p = 0;
        }

        goto done;
    }

    if (size > pool->min_size) {
        shift = 1;
        for (s = size - 1; s >>= 1; shift++) { /* void */ }
        slot = shift - pool->min_shift;

    } else {
        shift = pool->min_shift;
        slot = 0;
    }

    pool->stats[slot].reqs++;

    ngx_log_debug2(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                   "slab alloc: %uz slot: %ui", size, slot);

    slots = ngx_slab_slots(pool);
    page = slots[slot].next;

    if (page->next != page) {

        if (shift < ngx_slab_exact_shift) {

            bitmap = (uintptr_t *) ngx_slab_page_addr(pool, page);

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (n = 0; n < map; n++) {

                if (bitmap[n] != NGX_SLAB_BUSY) {

                    for (m = 1, i = 0; m; m <<= 1, i++) {
                        if (bitmap[n] & m) {
                            continue;
                        }

                        bitmap[n] |= m;

                        i = (n * sizeof(uintptr_t) * 8 + i) << shift;

                        p = (uintptr_t) bitmap + i;

                        pool->stats[slot].used++;

                        if (bitmap[n] == NGX_SLAB_BUSY) {
                            for (n = n + 1; n < map; n++) {
                                if (bitmap[n] != NGX_SLAB_BUSY) {
                                    goto done;
                                }
                            }

                            prev = ngx_slab_page_prev(page);
                            prev->next = page->next;
                            page->next->prev = page->prev;

                            page->next = NULL;
                            page->prev = NGX_SLAB_SMALL;
                        }

                        goto done;
                    }
                }
            }

        } else if (shift == ngx_slab_exact_shift) {

            for (m = 1, i = 0; m; m <<= 1, i++) {
                if (page->slab & m) {
                    continue;
                }

                page->slab |= m;

                if (page->slab == NGX_SLAB_BUSY) {
                    prev = ngx_slab_page_prev(page);
                    prev->next = page->next;
                    page->next->prev = page->prev;

                    page->next = NULL;
                    page->prev = NGX_SLAB_EXACT;
                }

                p = ngx_slab_page_addr(pool, page) + (i << shift);

                pool->stats[slot].used++;

                goto done;
            }

        } else { /* shift > ngx_slab_exact_shift */

            mask = ((uintptr_t) 1 << (ngx_pagesize >> shift)) - 1;
            mask <<= NGX_SLAB_MAP_SHIFT;

            for (m = (uintptr_t) 1 << NGX_SLAB_MAP_SHIFT, i = 0;
                 m & mask;
                 m <<= 1, i++)
            {
                if (page->slab & m) {
                    continue;
                }

                page->slab |= m;

                if ((page->slab & NGX_SLAB_MAP_MASK) == mask) {
                    prev = ngx_slab_page_prev(page);
                    prev->next = page->next;
                    page->next->prev = page->prev;

                    page->next = NULL;
                    page->prev = NGX_SLAB_BIG;
                }

                p = ngx_slab_page_addr(pool, page) + (i << shift);

                pool->stats[slot].used++;

                goto done;
            }
        }

        ngx_slab_error(pool, NGX_LOG_ALERT, "ngx_slab_alloc(): page is busy");
        ngx_debug_point();
    }

    page = ngx_slab_alloc_pages(pool, 1);

    if (page) {
        if (shift < ngx_slab_exact_shift) {
            bitmap = (uintptr_t *) ngx_slab_page_addr(pool, page);

            n = (ngx_pagesize >> shift) / ((1 << shift) * 8);

            if (n == 0) {
                n = 1;
            }

            /* "n" elements for bitmap, plus one requested */
            bitmap[0] = ((uintptr_t) 2 << n) - 1;

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (i = 1; i < map; i++) {
                bitmap[i] = 0;
            }

            page->slab = shift;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_SMALL;

            slots[slot].next = page;

            pool->stats[slot].total += (ngx_pagesize >> shift) - n;

            p = ngx_slab_page_addr(pool, page) + (n << shift);

            pool->stats[slot].used++;

            goto done;

        } else if (shift == ngx_slab_exact_shift) {

            page->slab = 1;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_EXACT;

            slots[slot].next = page;

            pool->stats[slot].total += sizeof(uintptr_t) * 8;

            p = ngx_slab_page_addr(pool, page);

            pool->stats[slot].used++;

            goto done;

        } else { /* shift > ngx_slab_exact_shift */

            page->slab = ((uintptr_t) 1 << NGX_SLAB_MAP_SHIFT) | shift;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_BIG;

            slots[slot].next = page;

            pool->stats[slot].total += ngx_pagesize >> shift;

            p = ngx_slab_page_addr(pool, page);

            pool->stats[slot].used++;

            goto done;
        }
    }

    p = 0;

    pool->stats[slot].fails++;

done:

    ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                   "slab alloc: %p", (void *) p);

    return (void *) p;
}